

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

void __thiscall
backend::codegen::Codegen::emit_compare
          (Codegen *this,VarId *dest,Value *lhs,Value *rhs,ConditionCode cond,bool reversed)

{
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  *this_00;
  vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
  *this_01;
  ConditionCode CVar1;
  Reg RVar2;
  undefined7 extraout_var;
  Inst *pIVar3;
  undefined3 in_register_00000081;
  undefined3 in_register_00000089;
  _Head_base<0UL,_arm::Inst_*,_false> local_a0;
  undefined4 local_94;
  _func_int **local_90;
  VarId *local_88;
  anon_class_8_1_a78179b7_conflict8 local_80;
  vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
  *local_78;
  undefined1 local_70 [8];
  _Move_ctor_base<false,_arm::RegisterOperand,_int> local_68;
  Operand2 local_50;
  
  local_94 = CONCAT31(in_register_00000081,cond);
  local_88 = dest;
  if (CONCAT31(in_register_00000089,reversed) != 0) {
    CVar1 = arm::reverse_cond(cond);
    local_94 = (undefined4)CONCAT71(extraout_var,CVar1);
  }
  RVar2 = translate_value_to_reg(this,lhs);
  translate_value_to_operand2(&local_50,this,rhs);
  pIVar3 = (Inst *)operator_new(0x38);
  std::__detail::__variant::_Move_ctor_base<false,_arm::RegisterOperand,_int>::_Move_ctor_base
            (&local_68,
             (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)
             &local_50.super_variant<arm::RegisterOperand,_int>);
  local_70 = (undefined1  [8])&PTR_display_001f0838;
  pIVar3->op = Cmp;
  pIVar3->cond = Always;
  local_90 = (_func_int **)&PTR_display_001f0948;
  (pIVar3->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001f0948;
  *(Reg *)&pIVar3[1].super_Displayable._vptr_Displayable = RVar2;
  local_80.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_int> *)(pIVar3 + 2);
  *(undefined1 *)&pIVar3[3].super_Displayable._vptr_Displayable = 0xff;
  *(__index_type *)&pIVar3[3].super_Displayable._vptr_Displayable =
       local_68.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
       super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
    ::_S_vtable._M_arr
    [(long)(char)local_68.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                 super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index + 1]._M_data)
            (&local_80,(variant<arm::RegisterOperand,_int> *)&local_68);
  this_00 = &this->inst;
  *(undefined ***)&pIVar3[1].op = &PTR_display_001f0838;
  local_a0._M_head_impl = pIVar3;
  std::
  vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
  ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
            ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
              *)this_00,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_a0);
  local_78 = (vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
              *)this_00;
  if (local_a0._M_head_impl != (Inst *)0x0) {
    (*((local_a0._M_head_impl)->super_Displayable)._vptr_Displayable[2])();
  }
  local_68.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
  super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_rest =
       (_Variadic_union<int>)local_88->id;
  local_70 = (undefined1  [8])&PTR_display_001ee058;
  RVar2 = get_or_alloc_vgp(this,(VarId *)local_70);
  local_50.super_variant<arm::RegisterOperand,_int>.super__Variant_base<arm::RegisterOperand,_int>.
  super__Move_assign_alias<arm::RegisterOperand,_int>.
  super__Copy_assign_alias<arm::RegisterOperand,_int>.
  super__Move_ctor_alias<arm::RegisterOperand,_int>.
  super__Copy_ctor_alias<arm::RegisterOperand,_int>.
  super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_rest = (_Variadic_union<int>)0x0;
  local_50.super_variant<arm::RegisterOperand,_int>.super__Variant_base<arm::RegisterOperand,_int>.
  super__Move_assign_alias<arm::RegisterOperand,_int>.
  super__Copy_assign_alias<arm::RegisterOperand,_int>.
  super__Move_ctor_alias<arm::RegisterOperand,_int>.
  super__Copy_ctor_alias<arm::RegisterOperand,_int>.
  super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index = '\x01';
  local_50.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001f0838;
  pIVar3 = (Inst *)operator_new(0x38);
  std::__detail::__variant::_Move_ctor_base<false,_arm::RegisterOperand,_int>::_Move_ctor_base
            (&local_68,
             (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)
             &local_50.super_variant<arm::RegisterOperand,_int>);
  local_70 = (undefined1  [8])&PTR_display_001f0838;
  pIVar3->op = Mov;
  pIVar3->cond = Always;
  (pIVar3->super_Displayable)._vptr_Displayable = local_90;
  *(Reg *)&pIVar3[1].super_Displayable._vptr_Displayable = RVar2;
  local_80.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_int> *)(pIVar3 + 2);
  *(undefined1 *)&pIVar3[3].super_Displayable._vptr_Displayable = 0xff;
  *(__index_type *)&pIVar3[3].super_Displayable._vptr_Displayable =
       local_68.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
       super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
    ::_S_vtable._M_arr
    [(long)(char)local_68.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                 super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index + 1]._M_data)
            (&local_80,(variant<arm::RegisterOperand,_int> *)&local_68);
  this_01 = local_78;
  *(undefined ***)&pIVar3[1].op = &PTR_display_001f0838;
  local_a0._M_head_impl = pIVar3;
  std::
  vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
  ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
            (local_78,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_a0);
  if (local_a0._M_head_impl != (Inst *)0x0) {
    (*((local_a0._M_head_impl)->super_Displayable)._vptr_Displayable[2])();
  }
  local_68.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
  super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_rest =
       (_Variadic_union<int>)local_88->id;
  local_70 = (undefined1  [8])&PTR_display_001ee058;
  RVar2 = get_or_alloc_vgp(this,(VarId *)local_70);
  local_50.super_variant<arm::RegisterOperand,_int>.super__Variant_base<arm::RegisterOperand,_int>.
  super__Move_assign_alias<arm::RegisterOperand,_int>.
  super__Copy_assign_alias<arm::RegisterOperand,_int>.
  super__Move_ctor_alias<arm::RegisterOperand,_int>.
  super__Copy_ctor_alias<arm::RegisterOperand,_int>.
  super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_rest = (_Variadic_union<int>)0x1;
  local_50.super_variant<arm::RegisterOperand,_int>.super__Variant_base<arm::RegisterOperand,_int>.
  super__Move_assign_alias<arm::RegisterOperand,_int>.
  super__Copy_assign_alias<arm::RegisterOperand,_int>.
  super__Move_ctor_alias<arm::RegisterOperand,_int>.
  super__Copy_ctor_alias<arm::RegisterOperand,_int>.
  super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index = '\x01';
  local_50.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001f0838;
  pIVar3 = (Inst *)operator_new(0x38);
  std::__detail::__variant::_Move_ctor_base<false,_arm::RegisterOperand,_int>::_Move_ctor_base
            (&local_68,
             (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)
             &local_50.super_variant<arm::RegisterOperand,_int>);
  local_70 = (undefined1  [8])&PTR_display_001f0838;
  pIVar3->op = Mov;
  pIVar3->cond = (ConditionCode)local_94;
  (pIVar3->super_Displayable)._vptr_Displayable = local_90;
  *(Reg *)&pIVar3[1].super_Displayable._vptr_Displayable = RVar2;
  local_80.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_int> *)(pIVar3 + 2);
  *(undefined1 *)&pIVar3[3].super_Displayable._vptr_Displayable = 0xff;
  *(__index_type *)&pIVar3[3].super_Displayable._vptr_Displayable =
       local_68.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
       super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
    ::_S_vtable._M_arr
    [(long)(char)local_68.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                 super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index + 1]._M_data)
            (&local_80,(variant<arm::RegisterOperand,_int> *)&local_68);
  *(undefined ***)&pIVar3[1].op = &PTR_display_001f0838;
  local_a0._M_head_impl = pIVar3;
  std::
  vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
  ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
            (this_01,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_a0);
  if (local_a0._M_head_impl != (Inst *)0x0) {
    (*((local_a0._M_head_impl)->super_Displayable)._vptr_Displayable[2])();
  }
  return;
}

Assistant:

void Codegen::emit_compare(mir::inst::VarId& dest, mir::inst::Value& lhs,
                           mir::inst::Value& rhs, arm::ConditionCode cond,
                           bool reversed) {
  if (reversed) {
    cond = reverse_cond(cond);
  }
  inst.push_back(
      std::make_unique<Arith2Inst>(OpCode::Cmp, translate_value_to_reg(lhs),
                                   translate_value_to_operand2(rhs)));

  inst.push_back(std::make_unique<Arith2Inst>(
      OpCode::Mov, translate_var_reg(dest), Operand2(0)));
  inst.push_back(std::make_unique<Arith2Inst>(
      OpCode::Mov, translate_var_reg(dest), Operand2(1), cond));
}